

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

int Cec2_ObjSimEqual(Gia_Man_t *p,int iObj0,int iObj1)

{
  word *pwVar1;
  word *pwVar2;
  ulong *puVar3;
  ulong *puVar4;
  word *pwVar5;
  word *pwVar6;
  ulong uVar7;
  ulong uVar8;
  
  pwVar5 = Cec2_ObjSim(p,iObj0);
  pwVar6 = Cec2_ObjSim(p,iObj1);
  uVar7 = 0;
  if (0 < p->nSimWords) {
    uVar7 = (ulong)(uint)p->nSimWords;
  }
  uVar8 = 0;
  if ((((uint)*pwVar6 ^ (uint)*pwVar5) & 1) == 0) {
    do {
      if (uVar7 == uVar8) {
        return 1;
      }
      pwVar1 = pwVar5 + uVar8;
      pwVar2 = pwVar6 + uVar8;
      uVar8 = uVar8 + 1;
    } while (*pwVar1 == *pwVar2);
  }
  else {
    do {
      if (uVar7 == uVar8) {
        return 1;
      }
      puVar3 = pwVar6 + uVar8;
      puVar4 = pwVar5 + uVar8;
      uVar8 = uVar8 + 1;
    } while ((*puVar3 ^ *puVar4) == 0xffffffffffffffff);
  }
  return 0;
}

Assistant:

static inline int Cec2_ObjSimEqual( Gia_Man_t * p, int iObj0, int iObj1 )
{
    int w;
    word * pSim0 = Cec2_ObjSim( p, iObj0 );
    word * pSim1 = Cec2_ObjSim( p, iObj1 );
    if ( (pSim0[0] & 1) == (pSim1[0] & 1) )
    {
        for ( w = 0; w < p->nSimWords; w++ )
            if ( pSim0[w] != pSim1[w] )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < p->nSimWords; w++ )
            if ( pSim0[w] != ~pSim1[w] )
                return 0;
        return 1;
    }
}